

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_lha_filename.c
# Opt level: O0

void test_read_format_lha_filename(void)

{
  char *refname;
  char *in_stack_00000010;
  char *in_stack_00000410;
  
  extract_reference_file(in_stack_00000410);
  test_read_format_lha_filename_CP932_eucJP(in_stack_00000010);
  test_read_format_lha_filename_CP932_UTF8(in_stack_00000010);
  test_read_format_lha_filename_CP932_Windows("test_read_format_lha_filename_cp932.lzh");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_lha_filename)
{
	/* A sample file was created with LHA32.EXE through UNLHA.DLL. */
	const char *refname = "test_read_format_lha_filename_cp932.lzh";

	extract_reference_file(refname);

	test_read_format_lha_filename_CP932_eucJP(refname);
	test_read_format_lha_filename_CP932_UTF8(refname);
	test_read_format_lha_filename_CP932_Windows(refname);
}